

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::ComputeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,ComputeTestInstance *this)

{
  VkDescriptorPool descriptorPool_00;
  VkDescriptorSet destSet;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer_s *pVVar1;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  RefData<vk::Handle<(vk::HandleType)14>_> data_02;
  RefData<vk::Handle<(vk::HandleType)16>_> data_03;
  RefData<vk::Handle<(vk::HandleType)18>_> data_04;
  RefData<vk::Handle<(vk::HandleType)24>_> data_05;
  RefData<vk::VkCommandBuffer_s_*> data_06;
  bool bVar2;
  deUint32 queueFamilyIndex_00;
  VkResult result;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  Handle<(vk::HandleType)21> *pHVar3;
  Handle<(vk::HandleType)19> *pHVar4;
  VkBuffer *pVVar5;
  Handle<(vk::HandleType)22> *pHVar6;
  DescriptorSetUpdateBuilder *this_02;
  ProgramCollection<vk::ProgramBinary> *this_03;
  ProgramBinary *binary;
  Handle<(vk::HandleType)16> *pHVar7;
  Handle<(vk::HandleType)14> *pHVar8;
  Handle<(vk::HandleType)24> *pHVar9;
  VkCommandBuffer_s **ppVVar10;
  Handle<(vk::HandleType)18> *pHVar11;
  VkDeviceSize offset;
  TestContext *this_04;
  TestLog *log;
  void *memory;
  allocator<char> local_5f1;
  string local_5f0;
  undefined4 local_5d0;
  allocator<char> local_5c9;
  string local_5c8;
  VkDeviceMemory local_5a8;
  Allocation *local_5a0;
  Allocation *resultAlloc;
  undefined1 local_590 [8];
  VkBufferMemoryBarrier shaderWriteBarrier;
  Move<vk::VkCommandBuffer_s_*> local_540;
  RefData<vk::VkCommandBuffer_s_*> local_520;
  undefined1 local_500 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_4c0;
  undefined1 local_4a0 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)18>_> local_470;
  RefData<vk::Handle<(vk::HandleType)18>_> local_450;
  undefined1 local_430 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::Handle<(vk::HandleType)16>_> local_408;
  RefData<vk::Handle<(vk::HandleType)16>_> local_3e8;
  undefined1 local_3c8 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  string local_3a0;
  Move<vk::Handle<(vk::HandleType)14>_> local_380;
  RefData<vk::Handle<(vk::HandleType)14>_> local_360;
  undefined1 local_340 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  VkSpecializationInfo *pSpecInfo;
  Specialization specialization;
  DescriptorSetUpdateBuilder local_2b8;
  deUint64 local_270;
  undefined1 local_268 [8];
  VkDescriptorBufferInfo descriptorBufferInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_240;
  RefData<vk::Handle<(vk::HandleType)22>_> local_220;
  undefined1 local_200 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_1c8;
  RefData<vk::Handle<(vk::HandleType)21>_> local_1a8;
  undefined1 local_188 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  DescriptorSetLayoutBuilder local_158;
  Move<vk::Handle<(vk::HandleType)19>_> local_110;
  RefData<vk::Handle<(vk::HandleType)19>_> local_f0;
  undefined1 local_d0 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  VkBufferCreateInfo local_a8;
  undefined1 local_70 [8];
  Buffer resultBuffer;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  ComputeTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex_00 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator_00 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = allocator_00;
  makeBufferCreateInfo(&local_a8,this->m_ssboSize,0x20);
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  pipeline::Buffer::Buffer
            ((Buffer *)local_70,vk_00,device_00,allocator_00,&local_a8,
             ::vk::MemoryRequirement::HostVisible);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_158);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (&local_158,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build(&local_110,this_00,vk_00,device_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_f0,(Move *)&local_110);
  data.deleter.m_deviceIface._0_4_ = (int)local_f0.deleter.m_deviceIface;
  data.object.m_internal = local_f0.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_f0.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_f0.deleter.m_device;
  data.deleter.m_allocator._0_4_ = (int)local_f0.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_f0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_d0,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_110);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_158);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)
                       &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                        m_pool,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build(&local_1c8,this_01,vk_00,device_00,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1a8,(Move *)&local_1c8);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_1a8.deleter.m_deviceIface;
  data_00.object.m_internal = local_1a8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1a8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_1a8.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_1a8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_1a8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_188,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_1c8);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_188);
  descriptorPool_00.m_internal = pHVar3->m_internal;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_d0);
  descriptorBufferInfo.range = pHVar4->m_internal;
  makeDescriptorSet(&local_240,vk_00,device_00,descriptorPool_00,
                    (VkDescriptorSetLayout)descriptorBufferInfo.range);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_220,(Move *)&local_240);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_220.deleter.m_deviceIface;
  data_01.object.m_internal = local_220.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_220.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_220.deleter.m_device;
  data_01.deleter.m_pool.m_internal._0_4_ = (int)local_220.deleter.m_pool.m_internal;
  data_01.deleter.m_pool.m_internal._4_4_ = (int)(local_220.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_200,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_240);
  pVVar5 = pipeline::Buffer::get((Buffer *)local_70);
  local_270 = pVVar5->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_268,(VkBuffer)local_270,0,this->m_ssboSize);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_2b8);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_200);
  destSet.m_internal = pHVar6->m_internal;
  specialization.m_specialization.pData =
       (void *)::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  this_02 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_2b8,destSet,(Location *)&specialization.m_specialization.pData,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,(VkDescriptorBufferInfo *)local_268);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk_00,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_2b8);
  Specialization::Specialization((Specialization *)&pSpecInfo,&this->m_specConstants);
  shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)Specialization::getSpecializationInfo((Specialization *)&pSpecInfo);
  this_03 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"comp",
             (allocator<char> *)
             ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                     m_allocator + 7));
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_03,&local_3a0);
  ::vk::createShaderModule(&local_380,vk_00,device_00,binary,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_360,(Move *)&local_380);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_360.deleter.m_deviceIface;
  data_02.object.m_internal = local_360.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_360.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_360.deleter.m_device;
  data_02.deleter.m_allocator._0_4_ = (int)local_360.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_360.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_340,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                     m_allocator + 7));
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_d0);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar4->m_internal;
  makePipelineLayout(&local_408,vk_00,device_00,
                     (VkDescriptorSetLayout)
                     pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3e8,(Move *)&local_408);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_3e8.deleter.m_deviceIface;
  data_03.object.m_internal = local_3e8.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3e8.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_3e8.deleter.m_device;
  data_03.deleter.m_allocator._0_4_ = (int)local_3e8.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_3e8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_3c8,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_408);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_3c8);
  pipelineLayout_00.m_internal = pHVar7->m_internal;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_340);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar8->m_internal;
  makeComputePipeline(&local_470,vk_00,device_00,pipelineLayout_00,
                      (VkShaderModule)
                      cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                      m_allocator,
                      (VkSpecializationInfo *)
                      shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                      m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_450,(Move *)&local_470);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_450.deleter.m_deviceIface;
  data_04.object.m_internal = local_450.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_450.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device = local_450.deleter.m_device;
  data_04.deleter.m_allocator._0_4_ = (int)local_450.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_450.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_430,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_470);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,device_00
             ,2,queueFamilyIndex_00,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_4c0,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_4c0.deleter.m_deviceIface;
  data_05.object.m_internal = local_4c0.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4c0.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device = local_4c0.deleter.m_device;
  data_05.deleter.m_allocator._0_4_ = (int)local_4c0.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_4c0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_4a0,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_4a0);
  makeCommandBuffer(&local_540,vk_00,device_00,(VkCommandPool)pHVar9->m_internal);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_520,(Move *)&local_540);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_520.deleter.m_deviceIface;
  data_06.object = local_520.object;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_520.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device = local_520.deleter.m_device;
  data_06.deleter.m_pool.m_internal._0_4_ = (int)local_520.deleter.m_pool.m_internal;
  data_06.deleter.m_pool.m_internal._4_4_ = (int)(local_520.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_500,data_06);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_540);
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_500);
  beginCommandBuffer(vk_00,*ppVVar10);
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_500);
  pVVar1 = *ppVVar10;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_430);
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar1,1,pHVar11->m_internal);
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_500);
  pVVar1 = *ppVVar10;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_3c8);
  shaderWriteBarrier.size = pHVar7->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_200);
  (*vk_00->_vptr_DeviceInterface[0x56])(vk_00,pVVar1,1,shaderWriteBarrier.size,0,1,pHVar6,0,0);
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_500);
  (*vk_00->_vptr_DeviceInterface[0x5d])(vk_00,*ppVVar10,1,1);
  pVVar5 = pipeline::Buffer::operator*((Buffer *)local_70);
  resultAlloc = (Allocation *)pVVar5->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_590,0x40,0x2000,(VkBuffer)resultAlloc,0,this->m_ssboSize
            );
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_500);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar10,0x800,0x4000,0,0,0,1,local_590,0,0);
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_500);
  result = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar10);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineSpecConstantTests.cpp"
                    ,0x207);
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_500);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar10);
  local_5a0 = pipeline::Buffer::getAllocation((Buffer *)local_70);
  local_5a8 = ::vk::Allocation::getMemory(local_5a0);
  offset = ::vk::Allocation::getOffset(local_5a0);
  ::vk::invalidateMappedMemoryRange(vk_00,device_00,local_5a8,offset,this->m_ssboSize);
  this_04 = Context::getTestContext((this->super_TestInstance).m_context);
  log = tcu::TestContext::getLog(this_04);
  memory = ::vk::Allocation::getHostPtr(local_5a0);
  bVar2 = verifyValues(log,memory,&this->m_expectedValues);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"Success",&local_5c9);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_5c8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator(&local_5c9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5f0,"Values did not match",&local_5f1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_5f0);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::allocator<char>::~allocator(&local_5f1);
  }
  local_5d0 = 1;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_500);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_4a0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_430);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_3c8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_340);
  Specialization::~Specialization((Specialization *)&pSpecInfo);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_200);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_188);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_d0);
  pipeline::Buffer::~Buffer((Buffer *)local_70);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ComputeTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Descriptors

	const Buffer resultBuffer(vk, device, allocator, makeBufferCreateInfo(m_ssboSize, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet        (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  descriptorBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, m_ssboSize);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorBufferInfo)
		.update(vk, device);

	// Specialization

	const Specialization        specialization (m_specConstants);
	const VkSpecializationInfo* pSpecInfo      = specialization.getSpecializationInfo();

	// Pipeline

	const Unique<VkShaderModule>   shaderModule  (createShaderModule (vk, device, m_context.getBinaryCollection().get("comp"), 0));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout (vk, device, *descriptorSetLayout));
	const Unique<VkPipeline>       pipeline      (makeComputePipeline(vk, device, *pipelineLayout, *shaderModule, pSpecInfo));
	const Unique<VkCommandPool>    cmdPool       (createCommandPool  (vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer     (makeCommandBuffer  (vk, device, *cmdPool));

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	vk.cmdDispatch(*cmdBuffer, 1u, 1u, 1u);

	{
		const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, m_ssboSize);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results

	const Allocation& resultAlloc = resultBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), m_ssboSize);

	if (verifyValues(m_context.getTestContext().getLog(), resultAlloc.getHostPtr(), m_expectedValues))
		return tcu::TestStatus::pass("Success");
	else
		return tcu::TestStatus::fail("Values did not match");
}